

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

shared_ptr<aeron::Subscription> __thiscall
aeron::archive::AeronArchive::replay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId,on_available_image_t *availableImageHandler,
          on_unavailable_image_t *unavailableImageHandler)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined4 in_register_0000008c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<aeron::Subscription> sVar5;
  on_unavailable_image_t *in_stack_00000018;
  string updatedReplayChannel;
  undefined1 local_68 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  iVar3 = startReplay((AeronArchive *)recordingId,position,length,(int64_t)replayChannel,
                      (string *)CONCAT44(in_register_0000008c,replayStreamId),
                      (int32_t)availableImageHandler);
  ChannelUri::addSessionId
            ((string *)(local_68 + 0x18),(string *)CONCAT44(in_register_0000008c,replayStreamId),
             (int32_t)iVar3);
  ClientConductor::addSubscription
            ((ClientConductor *)(*(long *)(recordingId + 0x128) + 0x24b0),
             (string *)(local_68 + 0x18),(int32_t)availableImageHandler,unavailableImageHandler,
             in_stack_00000018);
  (this->ctx_).cfg_.messageTimeoutNs = 0;
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    sVar5 = ClientConductor::findSubscription
                      ((ClientConductor *)local_68,*(long *)(recordingId + 0x128) + 0x24b0);
    uVar2 = local_68._8_8_;
    uVar1 = local_68._0_8_;
    _Var4 = sVar5.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    local_68._0_8_ = (_func_int **)0x0;
    local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var4._M_pi = extraout_RDX;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        _Var4._M_pi = extraout_RDX_00;
      }
    }
    if ((_func_int **)uVar1 != (_func_int **)0x0) break;
    sched_yield();
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  }
  (this->ctx_).cfg_.controlChannel._M_dataplus._M_p = (pointer)uVar2;
  (this->ctx_).cfg_.messageTimeoutNs = uVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._24_8_ != &local_40) {
    operator_delete((void *)local_68._24_8_,(ulong)(local_40._M_allocated_capacity + 1));
    _Var4._M_pi = extraout_RDX_01;
  }
  sVar5.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar5.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::Subscription> AeronArchive::replay(std::int64_t recordingId, std::int64_t position,
                                                          std::int64_t length, const std::string& replayChannel,
                                                          std::int32_t replayStreamId,
                                                          aeron::on_available_image_t&& availableImageHandler,
                                                          aeron::on_unavailable_image_t&& unavailableImageHandler) {
    std::int64_t replaySessionId = startReplay(recordingId, position, length, replayChannel, replayStreamId);

    std::string updatedReplayChannel = ChannelUri::addSessionId(replayChannel, replaySessionId);

    // wait for the subscription to become available
    std::int64_t subId = aeron_->addSubscription(updatedReplayChannel, replayStreamId, std::move(availableImageHandler),
                                                 std::move(unavailableImageHandler));

    std::shared_ptr<Subscription> subscription;
    while (!(subscription = aeron_->findSubscription(subId))) {
        std::this_thread::yield();
    }

    return subscription;
}